

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall
ON_PolyCurve::GetBBox(ON_PolyCurve *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ON_Curve **ppOVar4;
  bool local_39;
  bool local_2d;
  int local_2c;
  bool rc;
  int segment_index;
  int count;
  bool bGrowBox_local;
  double *boxmax_local;
  double *boxmin_local;
  ON_PolyCurve *this_local;
  
  iVar2 = Count(this);
  bVar1 = -(0 < iVar2);
  local_2c = 0;
  segment_index._3_1_ = bGrowBox;
  while( true ) {
    local_2d = (bool)(bVar1 & 1);
    local_39 = false;
    if (local_2c < iVar2) {
      local_39 = local_2d;
    }
    if (local_39 == false) break;
    ppOVar4 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_2c);
    iVar3 = (*((*ppOVar4)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x19])
                      (*ppOVar4,boxmin,boxmax,(ulong)(segment_index._3_1_ & 1));
    bVar1 = (byte)iVar3;
    segment_index._3_1_ = 1;
    local_2c = local_2c + 1;
  }
  return local_2d;
}

Assistant:

bool ON_PolyCurve::GetBBox( // returns true if successful
         double* boxmin,    // minimum
         double* boxmax,    // maximum
         bool bGrowBox
         ) const
{
  const int count = Count();
  int segment_index;
  bool rc = (count>0) ? true : false;
  for ( segment_index = 0; segment_index < count && rc; segment_index++ ) {
    rc = m_segment[segment_index]->GetBBox( boxmin, boxmax, bGrowBox );
    bGrowBox = true;
  }
  return rc;
}